

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

int __thiscall
pstore::brokerface::channel<pstore::descriptor_condition_variable>::remove
          (channel<pstore::descriptor_condition_variable> *this,char *__filename)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  char *local_10;
  
  local_10 = __filename;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar3 = (ulong)local_10 % *(ulong *)(this + 0x38);
  plVar4 = *(long **)(*(long *)(this + 0x30) + uVar3 * 8);
  plVar5 = (long *)0x0;
  if ((plVar4 != (long *)0x0) &&
     (plVar1 = (long *)*plVar4, plVar5 = plVar4, local_10 != (char *)((long *)*plVar4)[1])) {
    while (plVar4 = plVar1, plVar1 = (long *)*plVar4, plVar1 != (long *)0x0) {
      plVar5 = (long *)0x0;
      if (((ulong)plVar1[1] % *(ulong *)(this + 0x38) != uVar3) ||
         (plVar5 = plVar4, local_10 == (char *)plVar1[1])) goto LAB_001111c5;
    }
    plVar5 = (long *)0x0;
  }
LAB_001111c5:
  if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
    std::
    _Hashtable<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(this + 0x30),&local_10);
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this);
    return iVar2;
  }
  assert_failed("subscribers_.find (sub) != subscribers_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/brokerface/pubsub.hpp"
                ,0x130);
}

Assistant:

void channel<ConditionVariable>::remove (subscriber_type * sub) noexcept {
            std::lock_guard<std::mutex> const lock{mut_};
            PSTORE_ASSERT (subscribers_.find (sub) != subscribers_.end ());
            subscribers_.erase (sub);
        }